

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACS.cpp
# Opt level: O2

void __thiscall
imrt::ACS::ACS(ACS *this,vector<double,_std::allocator<double>_> *w,
              vector<double,_std::allocator<double>_> *Zmin,
              vector<double,_std::allocator<double>_> *Zmax,Collimator *_collimator,
              vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int max_apertures,
              int max_intensity,int initial_intensity,int step_intensity,int _n_ants,
              double _initial_pheromone,double _alpha,double _beta,double _rho)

{
  _Vector_base<double,_std::allocator<double>_> local_70;
  _Vector_base<double,_std::allocator<double>_> local_58;
  _Vector_base<double,_std::allocator<double>_> local_40;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_40,w);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_58,Zmin);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_70,Zmax);
  ACO::ACO(&this->super_ACO,(vector<double,_std::allocator<double>_> *)&local_40,
           (vector<double,_std::allocator<double>_> *)&local_58,
           (vector<double,_std::allocator<double>_> *)&local_70,_collimator,volumes,max_apertures,
           max_intensity,initial_intensity,step_intensity,_n_ants,_initial_pheromone,_alpha,_beta,
           _rho);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_70);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
  (this->super_ACO)._vptr_ACO = (_func_int **)&PTR__ACO_0013abb8;
  this->q0 = 0.5;
  calculateProbability(this);
  return;
}

Assistant:

ACS::ACS(vector<double> w, vector<double> Zmin, vector<double> Zmax, Collimator& _collimator,
           vector<Volume>& volumes, int max_apertures, int max_intensity, int initial_intensity,
           int step_intensity, int _n_ants, double _initial_pheromone, double _alpha, double _beta, double _rho):
           ACO(w, Zmin, Zmax, _collimator, volumes, max_apertures, max_intensity, initial_intensity,
               step_intensity, _n_ants, _initial_pheromone, _alpha, _beta, _rho){
             q0=0.5;
             calculateProbability();
             //printProbability();
           }